

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

ScalarFunction * duckdb::ListDistinctFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  FunctionNullHandling in_stack_ffffffffffffff38;
  allocator_type local_c1;
  code *bind_lambda;
  LogicalType local_a0;
  LogicalType local_88;
  LogicalType local_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  LogicalType local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,ANY);
  LogicalType::LIST(&local_70,&local_28);
  __l._M_len = 1;
  __l._M_array = &local_70;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_58,__l,&local_c1);
  LogicalType::LogicalType(&local_a0,ANY);
  LogicalType::LIST(&local_88,&local_a0);
  bind_lambda = ListDistinctFunction;
  LogicalType::LogicalType(&local_40,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_40;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff24;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff2c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_58,&local_88,
             (scalar_function_t *)&stack0xffffffffffffff40,ListDistinctBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             ListAggregatesInitLocalState,varargs,CONSISTENT,in_stack_ffffffffffffff38,bind_lambda);
  LogicalType::~LogicalType(&local_40);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff40);
  LogicalType::~LogicalType(&local_88);
  LogicalType::~LogicalType(&local_a0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  LogicalType::~LogicalType(&local_70);
  LogicalType::~LogicalType(&local_28);
  return in_RDI;
}

Assistant:

ScalarFunction ListDistinctFun::GetFunction() {
	return ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY),
	                      ListDistinctFunction, ListDistinctBind, nullptr, nullptr, ListAggregatesInitLocalState);
}